

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

tensor * __thiscall
dlib::
add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
::private_get_gradient_input
          (add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
           *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->gradient_input_is_stale == true) {
    this->gradient_input_is_stale = false;
    resizable_tensor::copy_size(&this->x_grad,&(this->cached_output).super_tensor);
    iVar2 = (*(this->x_grad).super_tensor._vptr_tensor[4])(&this->x_grad);
    lVar1 = (this->x_grad).super_tensor.m_size;
    if (lVar1 != 0) {
      memset((void *)CONCAT44(extraout_var,iVar2),0,lVar1 << 2);
    }
  }
  return &(this->x_grad).super_tensor;
}

Assistant:

tensor& private_get_gradient_input() 
        { 
            if (this_layer_operates_inplace())
            {
                return subnetwork->private_get_gradient_input();
            }
            else
            {
                if (gradient_input_is_stale)
                {
                    gradient_input_is_stale = false;
                    x_grad.copy_size(private_get_output());
                    x_grad = 0;
                }
                return x_grad; 
            }
        }